

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.cc
# Opt level: O1

ostream * operator<<(ostream *os,Bytes *in)

{
  size_t sVar1;
  Span<const_unsigned_char> in_00;
  string local_30;
  
  sVar1 = (in->span_).size_;
  if (sVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"<empty Bytes>",0xd);
  }
  else {
    in_00.size_ = sVar1;
    in_00.data_ = (in->span_).data_;
    EncodeHex_abi_cxx11_(&local_30,in_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_30._M_dataplus._M_p,local_30._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Bytes &in) {
  if (in.span_.empty()) {
    return os << "<empty Bytes>";
  }

  // Print a byte slice as hex.
  os << EncodeHex(in.span_);
  return os;
}